

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_sse4.cpp
# Opt level: O2

void storeA2RGB30PMFromARGB32PM_sse4<(QtPixelOrder)0>
               (uchar *dest,uint *src,int index,int count,QList<unsigned_int> *param_5,
               QDitherInfo *param_6)

{
  uint c;
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 in_XMM0 [16];
  undefined1 extraout_XMM0 [16];
  undefined1 auVar4 [16];
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)count;
  if (count < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    c = src[uVar3];
    uVar1 = c >> 0x18;
    if (uVar1 != 0) {
      if (uVar1 == 0xff) {
        uVar1 = qConvertRgb32ToRgb30<(QtPixelOrder)0>(c);
        in_XMM0 = extraout_XMM0;
      }
      else {
        auVar4._4_12_ = in_XMM0._4_12_;
        auVar4._0_4_ = (float)uVar1;
        auVar6._4_4_ = in_XMM0._4_4_;
        auVar6._0_4_ = auVar4._0_4_;
        auVar6._8_4_ = in_XMM0._8_4_;
        auVar6._12_4_ = in_XMM0._12_4_;
        auVar7 = rcpss(auVar6,auVar4);
        fVar5 = auVar7._0_4_;
        fVar5 = ((fVar5 + fVar5) - auVar4._0_4_ * fVar5 * fVar5) * (float)((c >> 0x1e) * 0x155);
        auVar4 = pmovzxbd(ZEXT416(c),ZEXT416(c));
        auVar7._0_4_ = (int)((float)auVar4._0_4_ * fVar5);
        auVar7._4_4_ = (int)((float)auVar4._4_4_ * fVar5);
        auVar7._8_4_ = (int)((float)auVar4._8_4_ * fVar5);
        auVar7._12_4_ = (int)((float)auVar4._12_4_ * fVar5);
        in_XMM0 = packusdw(auVar7,auVar7);
        uVar1 = (uint)in_XMM0._0_2_ | (uint)in_XMM0._4_2_ << 0x14 |
                (uint)in_XMM0._2_2_ << 10 | c & 0xc0000000;
      }
    }
    *(uint *)(dest + uVar3 * 4 + (long)index * 4) = uVar1;
  }
  return;
}

Assistant:

void QT_FASTCALL storeA2RGB30PMFromARGB32PM_sse4(uchar *dest, const uint *src, int index, int count,
                                                 const QList<QRgb> *, QDitherInfo *)
{
    uint *d = reinterpret_cast<uint *>(dest) + index;
    for (int i = 0; i < count; ++i)
        d[i] = qConvertArgb32ToA2rgb30_sse4<PixelOrder>(src[i]);
}